

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall NavierStokesBase::~NavierStokesBase(NavierStokesBase *this)

{
  MultiFab *pMVar1;
  FabArray<amrex::FArrayBox> *pFVar2;
  Diffusion *this_00;
  pointer pBVar3;
  pointer pBVar4;
  long lVar5;
  
  (this->super_AmrLevel)._vptr_AmrLevel = (_func_int **)&PTR__NavierStokesBase_0074f2c8;
  if (this->rho_qtime != (MultiFab *)0x0) {
    (*(this->rho_qtime->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])
              ();
  }
  if (this->rho_tqtime != (MultiFab *)0x0) {
    (*(this->rho_tqtime->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])
              ();
  }
  if (this->sync_reg != (SyncRegister *)0x0) {
    (*(this->sync_reg->super_BndryRegister)._vptr_BndryRegister[1])();
  }
  if (this->advflux_reg != (FluxRegister *)0x0) {
    (*(this->advflux_reg->super_BndryRegister)._vptr_BndryRegister[1])();
  }
  if (this->viscflux_reg != (FluxRegister *)0x0) {
    (*(this->viscflux_reg->super_BndryRegister)._vptr_BndryRegister[1])();
  }
  pMVar1 = this->u_mac;
  if (pMVar1 != (MultiFab *)0x0) {
    pFVar2 = pMVar1[-1].super_FabArray<amrex::FArrayBox>.os_temp._M_t.
             super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl;
    if (pFVar2 != (FabArray<amrex::FArrayBox> *)0x0) {
      lVar5 = (long)pFVar2 * 0x180;
      do {
        amrex::MultiFab::~MultiFab
                  ((MultiFab *)
                   ((long)&pMVar1[-1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                           _vptr_FabArrayBase + lVar5));
        lVar5 = lVar5 + -0x180;
      } while (lVar5 != 0);
    }
    operator_delete__(&pMVar1[-1].super_FabArray<amrex::FArrayBox>.os_temp,(long)pFVar2 * 0x180 + 8)
    ;
  }
  if (mac_projector != (MacProj *)0x0) {
    MacProj::cleanup(mac_projector,(EVP_PKEY_CTX *)(ulong)(uint)(this->super_AmrLevel).level);
  }
  if (this->viscn_cc != (MultiFab *)0x0) {
    (*(this->viscn_cc->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])()
    ;
  }
  if (this->viscnp1_cc != (MultiFab *)0x0) {
    (*(this->viscnp1_cc->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])
              ();
  }
  if (this->diffn_cc != (MultiFab *)0x0) {
    (*(this->diffn_cc->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])()
    ;
  }
  if (this->diffnp1_cc != (MultiFab *)0x0) {
    (*(this->diffnp1_cc->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])
              ();
  }
  this_00 = this->diffusion;
  if (this_00 != (Diffusion *)0x0) {
    Diffusion::~Diffusion(this_00);
    operator_delete(this_00,0x50);
  }
  amrex::BoxArray::~BoxArray(&this->old_intersect_new);
  std::
  vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ::~vector(&(this->radius).
             super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
           );
  amrex::MultiFab::~MultiFab(&this->rho_ctime);
  amrex::MultiFab::~MultiFab(&this->rho_ptime);
  amrex::MultiFab::~MultiFab(&this->rho_half);
  amrex::MultiFab::~MultiFab(&this->Ssync);
  amrex::MultiFab::~MultiFab(&this->Vsync);
  amrex::MultiFab::~MultiFab(&this->p_avg);
  amrex::MultiFab::~MultiFab(&this->rho_avg);
  pBVar3 = (this->m_bcrec_scalars_d).m_data;
  if (pBVar3 != (pointer)0x0) {
    operator_delete(pBVar3,(this->m_bcrec_scalars_d).m_capacity * 0x18);
  }
  pBVar3 = (this->m_bcrec_velocity_d).m_data;
  if (pBVar3 != (pointer)0x0) {
    operator_delete(pBVar3,(this->m_bcrec_velocity_d).m_capacity * 0x18);
  }
  pBVar4 = (this->m_bcrec_scalars).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pBVar4 != (pointer)0x0) {
    operator_delete(pBVar4,(long)(this->m_bcrec_scalars).
                                 super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                 super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pBVar4);
  }
  pBVar4 = (this->m_bcrec_velocity).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pBVar4 != (pointer)0x0) {
    operator_delete(pBVar4,(long)(this->m_bcrec_velocity).
                                 super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                 super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pBVar4);
  }
  amrex::FabArray<amrex::BaseFab<int>_>::~FabArray(&this->ebmask);
  lVar5 = 0x840;
  do {
    amrex::MultiFab::~MultiFab
              ((MultiFab *)((long)(this->super_AmrLevel).geom.super_CoordSys.offset + lVar5 + -0x18)
              );
    lVar5 = lVar5 + -0x180;
  } while (lVar5 != 0x3c0);
  amrex::MultiFab::~MultiFab(&this->volume);
  amrex::AmrLevel::~AmrLevel(&this->super_AmrLevel);
  return;
}

Assistant:

NavierStokesBase::~NavierStokesBase ()
{
    delete rho_qtime;
    delete rho_tqtime;
    delete sync_reg;
    delete advflux_reg;
    delete viscflux_reg;
    delete [] u_mac;

    if (mac_projector != nullptr) {
        mac_projector->cleanup(level);
    }
    //
    // Remove the arrays for variable viscosity and diffusivity
    // and delete the Diffusion object
    //
    delete viscn_cc;
    delete viscnp1_cc;
    delete diffn_cc;
    delete diffnp1_cc;

    delete diffusion;
}